

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderAtomicOrCase::verify
          (ShaderAtomicOrCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  Precision PVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  Hex<8UL> hex;
  uint uVar11;
  Hex<8UL> hex_00;
  Hex<8UL> hex_01;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  int in_stack_00000008;
  long in_stack_00000010;
  undefined1 local_1b0 [384];
  
  uVar11 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
           (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2] *
           (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  uVar5 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
          (long)(int)uVar11;
  PVar2 = (this->super_ShaderAtomicOpCase).m_precision;
  uVar14 = 0xff;
  if (PVar2 == PRECISION_MEDIUMP) {
    uVar14 = 0xffff;
  }
  if ((this->super_ShaderAtomicOpCase).m_type == TYPE_UINT) {
    uVar14 = 0xffffffff;
  }
  if (PVar2 == PRECISION_HIGHP) {
    uVar14 = 0xffffffff;
  }
  iVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar11) {
    uVar8 = (ulong)uVar11;
  }
  uVar17 = 0;
  if (0 < (int)uVar5) {
    uVar17 = uVar5 & 0xffffffff;
  }
  uVar3 = (this->super_ShaderAtomicOpCase).m_initialValue;
  iVar6 = 0;
  uVar13 = 0;
  do {
    if (uVar13 == uVar17) {
LAB_0124851e:
      return (int)CONCAT71((int7)(int3)(uVar5 >> 8),(long)(int)uVar5 <= (long)uVar13);
    }
    iVar9 = (int)uVar13;
    uVar4 = *(uint *)(in_stack_00000010 + iVar9 * in_stack_00000008);
    hex_00.value._4_4_ = 0;
    hex_00.value._0_4_ = uVar4;
    uVar12 = uVar8;
    uVar10 = uVar3;
    iVar15 = iVar6;
    while (bVar19 = uVar12 != 0, uVar12 = uVar12 - 1, bVar19) {
      uVar10 = uVar10 | *(uint *)(siglen + (long)iVar15);
      iVar15 = iVar15 + (int)sig;
    }
    if (((uVar10 ^ uVar4) & uVar14) != 0) {
      local_1b0._0_8_ =
           ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"ERROR: at group ");
      std::ostream::operator<<(poVar1,iVar9);
      std::operator<<((ostream *)poVar1,": expected ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = uVar10;
      tcu::Format::operator<<((ostream *)poVar1,hex);
      std::operator<<((ostream *)poVar1,", got ");
      tcu::Format::operator<<((ostream *)poVar1,hex_00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01248516:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      goto LAB_0124851e;
    }
    iVar15 = -1;
    uVar12 = uVar8;
    iVar16 = iVar7;
    while (bVar19 = uVar12 != 0, uVar12 = uVar12 - 1, bVar19) {
      lVar18 = (long)iVar16;
      hex_01.value._4_4_ = 0;
      hex_01.value._0_4_ = *(uint *)(tbslen + lVar18);
      iVar15 = iVar15 + 1;
      iVar16 = iVar16 + (int)tbs;
      if ((*(uint *)(tbslen + lVar18) & uVar14 & uVar3) == 0) {
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"ERROR: at group ");
        std::ostream::operator<<(poVar1,iVar9);
        std::operator<<((ostream *)poVar1,", invocation ");
        std::ostream::operator<<(poVar1,iVar15);
        std::operator<<((ostream *)poVar1,": found unexpected value ");
        tcu::Format::operator<<((ostream *)poVar1,hex_01);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_01248516;
      }
    }
    uVar13 = uVar13 + 1;
    iVar6 = iVar6 + uVar11 * (int)sig;
    iVar7 = iVar7 + uVar11 * (int)tbs;
  } while( true );
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	compareMask		= (m_type == TYPE_UINT || numBits == 32) ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			deUint32		expectedValue	= m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 inputValue = *(const deUint32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				expectedValue |= inputValue;
			}

			if ((groupOutput & compareMask) != (expectedValue & compareMask))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected " << tcu::toHex(expectedValue) << ", got " << tcu::toHex(groupOutput) << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if ((compareMask & (outputValue & m_initialValue)) == 0)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << tcu::toHex(outputValue)
									   << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}